

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void verb_prog_tie_rope(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *txt;
  OBJ_DATA *obj_00;
  OBJ_AFFECT_DATA oaf;
  OBJ_AFFECT_DATA local_70;
  
  if (ch->in_room->vnum == 0x5fe4) {
    for (obj_00 = ch->in_room->contents; obj_00 != (OBJ_DATA *)0x0; obj_00 = obj_00->next_content) {
      if (obj_00->pIndexData->vnum == 0x5fe4) goto LAB_002da9de;
    }
    obj_00 = (OBJ_DATA *)0x0;
LAB_002da9de:
    bVar1 = is_affected_obj(obj_00,(int)gsn_trip);
    if (!bVar1) {
      act("You tie a length of rope between the wheel and the metal plate.",ch,(void *)0x0,
          (void *)0x0,3);
      act("$n ties a length of rope between the wheel and the metal plate.",ch,(void *)0x0,
          (void *)0x0,0);
      init_affect_obj(&local_70);
      local_70.where = 0;
      local_70.duration = 0xc;
      local_70.type = gsn_trip;
      local_70.end_fun = rope_end;
      affect_to_obj(obj_00,&local_70);
      obj_from_char(obj);
      extract_obj(obj);
      return;
    }
    txt = "There is already a rope tied to that wheel!\n\r";
  }
  else {
    txt = "There is nothing to tie the rope to here!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void verb_prog_tie_rope(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj2;
	OBJ_AFFECT_DATA oaf;

	if (ch->in_room->vnum != 24548)
	{
		send_to_char("There is nothing to tie the rope to here!\n\r", ch);
		return;
	}

	for (obj2 = ch->in_room->contents; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj2->pIndexData->vnum == 24548)
			break;
	}

	if (is_affected_obj(obj2, gsn_trip))
	{
		send_to_char("There is already a rope tied to that wheel!\n\r", ch);
		return;
	}

	act("You tie a length of rope between the wheel and the metal plate.", ch, 0, 0, TO_CHAR);
	act("$n ties a length of rope between the wheel and the metal plate.", ch, 0, 0, TO_ROOM);

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.duration = 12;
	oaf.type = gsn_trip;
	oaf.end_fun = rope_end;
	affect_to_obj(obj2, &oaf);

	obj_from_char(obj);
	extract_obj(obj);
}